

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O2

QByteArray *
qdtoAscii(QByteArray *__return_storage_ptr__,double d,DoubleForm form,int precision,bool uppercase)

{
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char *pcVar4;
  DoubleForm DVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  qsizetype i;
  long lVar13;
  storage_type *psVar14;
  ulong uVar15;
  int iVar16;
  qsizetype i_1;
  long lVar17;
  long in_FS_OFFSET;
  bool bVar18;
  ulong uVar19;
  double dVar20;
  QByteArrayView a;
  QByteArrayView a_00;
  QByteArrayView a_01;
  QByteArrayView a_02;
  QByteArrayView a_03;
  QByteArrayView a_04;
  QByteArrayView a_05;
  double local_1e8;
  QArrayDataPointer<char> local_1c8;
  int local_1a4;
  int length;
  bool negative;
  QVarLengthArray<char,_323LL> buffer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar15 = 6;
  if (-1 < precision) {
    uVar15 = (ulong)(uint)precision;
  }
  if (precision == -0x80) {
    uVar15 = 0xffffff80;
  }
  iVar8 = (int)uVar15;
  if (iVar8 == -0x80) {
    iVar12 = 0x12;
  }
  else if ((ulong)ABS(d) < 0x7ff0000000000000 && form == DFDecimal) {
    dVar20 = (double)((ulong)DAT_0016ee60 ^ (ulong)d);
    uVar19 = -(ulong)(d < dVar20);
    iVar12 = iVar8 + 0x136;
    if ((double)(~uVar19 & (ulong)d | (ulong)dVar20 & uVar19) <= 524288.0) {
      iVar12 = iVar8 + 7;
    }
  }
  else {
    iVar12 = 2;
    if (2 < iVar8) {
      iVar12 = iVar8;
    }
    iVar12 = iVar12 + 2;
  }
  local_1e8 = (double)((ulong)DAT_001620f0 & (ulong)d);
  memset(&buffer,0xaa,0x160);
  QVarLengthArray<char,_323LL>::QVarLengthArray(&buffer,(long)iVar12);
  length = 0;
  local_1a4 = 0;
  negative = false;
  qt_doubleToAscii(d,form,iVar8,(char *)buffer.super_QVLABase<char>.super_QVLABaseBase.ptr,
                   buffer.super_QVLABase<char>.super_QVLABaseBase.s,&negative,&length,&local_1a4);
  bVar18 = negative;
  iVar12 = length;
  lVar13 = (long)length;
  uVar19 = (ulong)negative;
  lVar17 = lVar13 + uVar19;
  DVar5 = form;
  if (local_1e8 != INFINITY) {
    if (form == DFSignificantDigits) {
      DVar5 = resolveFormat(iVar8,local_1a4,lVar13);
    }
    if (DVar5 == DFDecimal) {
      if (local_1a4 < 1) {
        uVar11 = (ulong)(2 - local_1a4);
      }
      else if (local_1a4 < iVar12) {
        uVar11 = 1;
      }
      else {
        uVar11 = (ulong)(local_1a4 - iVar12);
      }
      lVar17 = lVar17 + uVar11;
      DVar5 = DFDecimal;
      if (0 < iVar8 && form != DFSignificantDigits) {
        if (local_1a4 < iVar12) {
          uVar10 = (iVar8 - iVar12) + local_1a4;
          uVar6 = 0;
          if (0 < (int)uVar10) {
            uVar6 = uVar10;
          }
          lVar17 = lVar17 + (ulong)uVar6;
        }
        else {
          lVar17 = lVar17 + uVar15 + 1;
        }
      }
    }
    else if (DVar5 == DFExponent) {
      uVar6 = (iVar8 - iVar12) + 1;
      uVar15 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar15 = 0;
      }
      if (form == DFSignificantDigits) {
        uVar15 = 0;
      }
      iVar7 = local_1a4 + -1;
      iVar16 = -iVar7;
      if (0 < iVar7) {
        iVar16 = iVar7;
      }
      uVar6 = digits(iVar16);
      uVar11 = 2;
      if (2 < (int)uVar6) {
        uVar11 = (ulong)uVar6;
      }
      lVar17 = lVar17 + uVar15 + uVar11 + 3;
      DVar5 = DFExponent;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QByteArray::reserve(__return_storage_ptr__,lVar17);
  if (d != 0.0 && bVar18 == true) {
    QByteArray::append(__return_storage_ptr__,'-');
  }
  iVar16 = local_1a4;
  if (local_1e8 == INFINITY) {
    a_01.m_data = (storage_type *)buffer.super_QVLABase<char>.super_QVLABaseBase.ptr;
    a_01.m_size = lVar13;
    QByteArray::append(__return_storage_ptr__,a_01);
    if (uppercase) {
      QByteArray::toUpper_helper((QByteArray *)&local_1c8,__return_storage_ptr__);
      pDVar3 = (__return_storage_ptr__->d).d;
      pcVar4 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_1c8.d;
      (__return_storage_ptr__->d).ptr = local_1c8.ptr;
      qVar2 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_1c8.size;
      local_1c8.d = pDVar3;
      local_1c8.ptr = pcVar4;
      local_1c8.size = qVar2;
      QArrayDataPointer<char>::~QArrayDataPointer(&local_1c8);
    }
    goto LAB_0014ac99;
  }
  if (DVar5 != DFDecimal) {
    if (DVar5 == DFExponent) {
      a.m_data = (storage_type *)buffer.super_QVLABase<char>.super_QVLABaseBase.ptr;
      a.m_size = 1;
      QByteArray::append(__return_storage_ptr__,a);
      lVar13 = lVar13 + -1;
      if (0 < iVar8 && form != DFSignificantDigits || lVar13 != 0) {
        QByteArray::append(__return_storage_ptr__,'.');
        a_00.m_data = (storage_type *)((long)buffer.super_QVLABase<char>.super_QVLABaseBase.ptr + 1)
        ;
        a_00.m_size = lVar13;
        QByteArray::append(__return_storage_ptr__,a_00);
        if ((form != DFSignificantDigits) && (lVar13 = iVar8 - lVar13, 0 < lVar13)) {
          while (bVar18 = lVar13 != 0, lVar13 = lVar13 + -1, bVar18) {
            QByteArray::append(__return_storage_ptr__,'0');
          }
        }
      }
      iVar8 = local_1a4;
      uVar6 = local_1a4 - 1;
      QByteArray::append(__return_storage_ptr__,!uppercase << 5 | 0x45);
      QByteArray::append(__return_storage_ptr__,(iVar8 < 1) * '\x02' + '+');
      uVar10 = -uVar6;
      if (0 < (int)uVar6) {
        uVar10 = uVar6;
      }
      iVar8 = digits(uVar10);
      if (iVar8 == 1) {
        QByteArray::append(__return_storage_ptr__,'0');
      }
      QByteArray::resize(__return_storage_ptr__,(long)iVar8 + (__return_storage_ptr__->d).size);
      pbVar9 = (byte *)QByteArray::end(__return_storage_ptr__);
      uVar15 = (ulong)uVar10;
      do {
        pbVar9 = pbVar9 + -1;
        *pbVar9 = (byte)(uVar15 % 10) | 0x30;
        bVar18 = 9 < uVar15;
        uVar15 = uVar15 / 10;
      } while (bVar18);
    }
    goto LAB_0014ac99;
  }
  lVar17 = (long)local_1a4;
  if (lVar17 < 0) {
    QByteArray::append(__return_storage_ptr__,"0.0");
    while (iVar16 = iVar16 + 1, iVar16 != 0) {
      QByteArray::append(__return_storage_ptr__,'0');
    }
    a_03.m_data = (storage_type *)buffer.super_QVLABase<char>.super_QVLABaseBase.ptr;
    a_03.m_size = lVar13;
    QByteArray::append(__return_storage_ptr__,a_03);
    if (form != DFSignificantDigits) {
      for (lVar17 = ((__return_storage_ptr__->d).size - uVar19) + -2; lVar17 < iVar8;
          lVar17 = lVar17 + 1) {
        QByteArray::append(__return_storage_ptr__,'0');
      }
    }
    goto LAB_0014ac99;
  }
  if (iVar12 < local_1a4) {
    a_02.m_data = (storage_type *)buffer.super_QVLABase<char>.super_QVLABaseBase.ptr;
    a_02.m_size = lVar13;
    QByteArray::append(__return_storage_ptr__,a_02);
    buffer.super_QVLABase<char>.super_QVLABaseBase.ptr = (storage_type *)0x0;
    while ((ulong)(__return_storage_ptr__->d).size < lVar17 + uVar19) {
      QByteArray::append(__return_storage_ptr__,'0');
    }
LAB_0014adc6:
    if (iVar8 < 1 || form == DFSignificantDigits) goto LAB_0014ac99;
    lVar13 = 0;
    psVar14 = (storage_type *)buffer.super_QVLABase<char>.super_QVLABaseBase.ptr;
  }
  else {
    if (local_1a4 == 0) {
      QByteArray::append(__return_storage_ptr__,'0');
    }
    else {
      a_04.m_data = (storage_type *)buffer.super_QVLABase<char>.super_QVLABaseBase.ptr;
      a_04.m_size = lVar17;
      QByteArray::append(__return_storage_ptr__,a_04);
      buffer.super_QVLABase<char>.super_QVLABaseBase.ptr =
           (void *)((long)buffer.super_QVLABase<char>.super_QVLABaseBase.ptr + lVar17);
      lVar13 = lVar13 - lVar17;
    }
    psVar14 = (storage_type *)buffer.super_QVLABase<char>.super_QVLABaseBase.ptr;
    if (lVar13 == 0) goto LAB_0014adc6;
  }
  QByteArray::append(__return_storage_ptr__,'.');
  a_05.m_data = psVar14;
  a_05.m_size = lVar13;
  QByteArray::append(__return_storage_ptr__,a_05);
  if (form != DFSignificantDigits) {
    for (; lVar13 < iVar8; lVar13 = lVar13 + 1) {
      QByteArray::append(__return_storage_ptr__,'0');
    }
  }
LAB_0014ac99:
  QVarLengthArray<char,_323LL>::~QVarLengthArray(&buffer);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray qdtoAscii(double d, QLocaleData::DoubleForm form, int precision, bool uppercase)
{
    return dtoString<QByteArray>(d, form, precision, uppercase);
}